

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin1.c
# Opt level: O0

void Saig_ManCexMinVerifyPhase(Aig_Man_t *pAig,Abc_Cex_t *pCex,int f)

{
  Vec_Ptr_t *pVVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Aig_Obj_t *pAVar6;
  void *pvVar7;
  Aig_Obj_t *pAVar8;
  int local_2c;
  int i;
  Aig_Obj_t *pObj;
  int f_local;
  Abc_Cex_t *pCex_local;
  Aig_Man_t *pAig_local;
  
  pAVar6 = Aig_ManConst1(pAig);
  *(ulong *)&pAVar6->field_0x18 = *(ulong *)&pAVar6->field_0x18 & 0xfffffffffffffff7 | 8;
  for (local_2c = 0; iVar3 = Saig_ManPiNum(pAig), local_2c < iVar3; local_2c = local_2c + 1) {
    pvVar7 = Vec_PtrEntry(pAig->vCis,local_2c);
    uVar5 = Abc_InfoHasBit((uint *)(pCex + 1),pCex->nRegs + f * pCex->nPis + local_2c);
    *(ulong *)((long)pvVar7 + 0x18) =
         *(ulong *)((long)pvVar7 + 0x18) & 0xfffffffffffffff7 | ((ulong)uVar5 & 1) << 3;
  }
  if (f == 0) {
    for (local_2c = 0; iVar3 = Saig_ManRegNum(pAig), local_2c < iVar3; local_2c = local_2c + 1) {
      pVVar1 = pAig->vCis;
      iVar3 = Saig_ManPiNum(pAig);
      pvVar7 = Vec_PtrEntry(pVVar1,local_2c + iVar3);
      *(ulong *)((long)pvVar7 + 0x18) = *(ulong *)((long)pvVar7 + 0x18) & 0xfffffffffffffff7;
    }
  }
  else {
    for (local_2c = 0; iVar3 = Saig_ManRegNum(pAig), local_2c < iVar3; local_2c = local_2c + 1) {
      pVVar1 = pAig->vCis;
      iVar3 = Saig_ManPiNum(pAig);
      pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pVVar1,local_2c + iVar3);
      pAVar8 = Saig_ObjLoToLi(pAig,pAVar6);
      *(ulong *)&pAVar6->field_0x18 =
           *(ulong *)&pAVar6->field_0x18 & 0xfffffffffffffff7 |
           (ulong)((uint)(*(ulong *)&pAVar8->field_0x18 >> 3) & 1) << 3;
    }
  }
  for (local_2c = 0; iVar3 = Vec_PtrSize(pAig->vObjs), local_2c < iVar3; local_2c = local_2c + 1) {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,local_2c);
    if ((pAVar6 != (Aig_Obj_t *)0x0) && (iVar3 = Aig_ObjIsNode(pAVar6), iVar3 != 0)) {
      uVar5 = Aig_ObjFaninC0(pAVar6);
      pAVar8 = Aig_ObjFanin0(pAVar6);
      uVar2 = *(ulong *)&pAVar8->field_0x18;
      uVar4 = Aig_ObjFaninC1(pAVar6);
      pAVar8 = Aig_ObjFanin1(pAVar6);
      *(ulong *)&pAVar6->field_0x18 =
           *(ulong *)&pAVar6->field_0x18 & 0xfffffffffffffff7 |
           ((ulong)((uVar5 ^ (uint)(uVar2 >> 3) & 1) &
                   (uVar4 ^ (uint)(*(ulong *)&pAVar8->field_0x18 >> 3) & 1)) & 1) << 3;
    }
  }
  for (local_2c = 0; iVar3 = Vec_PtrSize(pAig->vCos), local_2c < iVar3; local_2c = local_2c + 1) {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,local_2c);
    uVar5 = Aig_ObjFaninC0(pAVar6);
    pAVar8 = Aig_ObjFanin0(pAVar6);
    *(ulong *)&pAVar6->field_0x18 =
         *(ulong *)&pAVar6->field_0x18 & 0xfffffffffffffff7 |
         ((ulong)(uVar5 ^ (uint)(*(ulong *)&pAVar8->field_0x18 >> 3) & 1) & 1) << 3;
  }
  return;
}

Assistant:

void Saig_ManCexMinVerifyPhase( Aig_Man_t * pAig, Abc_Cex_t * pCex, int f )
{
    Aig_Obj_t * pObj;
    int i;
    Aig_ManConst1(pAig)->fPhase = 1;
    Saig_ManForEachPi( pAig, pObj, i )
        pObj->fPhase = Abc_InfoHasBit(pCex->pData, pCex->nRegs + f * pCex->nPis + i);
    if ( f == 0 )
    {
        Saig_ManForEachLo( pAig, pObj, i )
            pObj->fPhase = 0;
    }
    else
    {
        Saig_ManForEachLo( pAig, pObj, i )
            pObj->fPhase = Saig_ObjLoToLi(pAig, pObj)->fPhase;
    }
    Aig_ManForEachNode( pAig, pObj, i )
        pObj->fPhase = (Aig_ObjFaninC0(pObj) ^ Aig_ObjFanin0(pObj)->fPhase) & 
                       (Aig_ObjFaninC1(pObj) ^ Aig_ObjFanin1(pObj)->fPhase);
    Aig_ManForEachCo( pAig, pObj, i )
        pObj->fPhase = (Aig_ObjFaninC0(pObj) ^ Aig_ObjFanin0(pObj)->fPhase);
}